

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

double VP8LBitsEntropy(uint32_t *array,int n)

{
  double dVar1;
  VP8LBitEntropy entropy;
  VP8LBitEntropy local_20;
  
  VP8LBitsEntropyUnrefined(array,n,&local_20);
  if (local_20.nonzeros < 5) {
    if (local_20.nonzeros < 2) {
      return 0.0;
    }
    if (local_20.nonzeros == 3) {
      dVar1 = 0.95;
    }
    else {
      if (local_20.nonzeros == 2) {
        return (double)local_20.sum * 0.99 + local_20.entropy * 0.01;
      }
      dVar1 = 0.7;
    }
  }
  else {
    dVar1 = 0.627;
  }
  dVar1 = (double)(local_20.sum * 2 - local_20.max_val) * dVar1 + (1.0 - dVar1) * local_20.entropy;
  if (dVar1 <= local_20.entropy) {
    dVar1 = local_20.entropy;
  }
  return dVar1;
}

Assistant:

double VP8LBitsEntropy(const uint32_t* const array, int n) {
  VP8LBitEntropy entropy;
  VP8LBitsEntropyUnrefined(array, n, &entropy);

  return BitsEntropyRefine(&entropy);
}